

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

char * __thiscall cmCustomCommandGenerator::GetArgv0Location(cmCustomCommandGenerator *this,uint c)

{
  bool bVar1;
  bool bVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  TargetType TVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar5;
  cmMakefile *this_02;
  byte local_99;
  byte local_8c;
  allocator local_89;
  string local_88;
  byte local_65;
  byte local_52;
  allocator local_51;
  string local_50;
  cmGeneratorTarget *local_30;
  cmGeneratorTarget *target;
  string *argv0;
  cmCustomCommandGenerator *pcStack_18;
  uint c_local;
  cmCustomCommandGenerator *this_local;
  
  argv0._4_4_ = c;
  pcStack_18 = this;
  this_01 = &std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::operator[]
                       (&(this->CommandLines).
                         super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                        (ulong)c)->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  target = (cmGeneratorTarget *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](this_01,0);
  local_30 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,(string *)target);
  local_52 = 0;
  local_65 = 0;
  bVar2 = false;
  bVar1 = false;
  local_8c = 0;
  if (local_30 != (cmGeneratorTarget *)0x0) {
    TVar4 = cmGeneratorTarget::GetType(local_30);
    local_8c = 0;
    if (TVar4 == EXECUTABLE) {
      bVar3 = cmGeneratorTarget::IsImported(local_30);
      this_00 = local_30;
      local_99 = 1;
      if (!bVar3) {
        std::allocator<char>::allocator();
        local_52 = 1;
        std::__cxx11::string::string((string *)&local_50,"CROSSCOMPILING_EMULATOR",&local_51);
        local_65 = 1;
        pcVar5 = cmGeneratorTarget::GetProperty(this_00,&local_50);
        local_99 = 1;
        if (pcVar5 == (char *)0x0) {
          this_02 = cmLocalGenerator::GetMakefile(this->LG);
          std::allocator<char>::allocator();
          bVar2 = true;
          std::__cxx11::string::string((string *)&local_88,"CMAKE_CROSSCOMPILING",&local_89);
          bVar1 = true;
          bVar3 = cmMakefile::IsOn(this_02,&local_88);
          local_99 = bVar3 ^ 0xff;
        }
      }
      local_8c = local_99;
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (bVar2) {
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  if ((local_65 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  if ((local_8c & 1) == 0) {
    this_local = (cmCustomCommandGenerator *)0x0;
  }
  else {
    this_local = (cmCustomCommandGenerator *)cmGeneratorTarget::GetLocation(local_30,&this->Config);
  }
  return (char *)this_local;
}

Assistant:

const char* cmCustomCommandGenerator::GetArgv0Location(unsigned int c) const
{
  std::string const& argv0 = this->CommandLines[c][0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(argv0);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE &&
      (target->IsImported() ||
       target->GetProperty("CROSSCOMPILING_EMULATOR") ||
       !this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING"))) {
    return target->GetLocation(this->Config);
  }
  return CM_NULLPTR;
}